

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

matches * atomvec_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  undefined8 uVar2;
  char *__s1;
  char *__s;
  ulonglong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 *__ptr;
  size_t sVar7;
  ulonglong uVar8;
  matches *pmVar9;
  match *pmVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  easm_expr *peVar15;
  ulonglong uVar16;
  bool bVar17;
  char *end;
  match res;
  ulong local_118;
  ulonglong local_f8;
  char *local_f0;
  match local_e8;
  
  if (ctx->atomsnum != spos) {
    plVar1 = ctx->atoms[spos];
    uVar12 = 0;
    if (plVar1->type != LITEM_EXPR) {
      return (matches *)0x0;
    }
    memset(&local_e8,0,0xb8);
    local_e8.lpos = spos + 1;
    peVar15 = plVar1->expr;
    if (peVar15->type == EASM_EXPR_ZVEC) {
      __ptr = (undefined8 *)0x0;
    }
    else {
      if (peVar15->type == EASM_EXPR_VEC) {
        uVar13 = 0;
        __ptr = (undefined8 *)0x0;
        iVar5 = 0;
        do {
          if ((long)iVar5 <= (long)uVar13) {
            iVar4 = iVar5 * 2;
            if (iVar5 == 0) {
              iVar4 = 0x10;
            }
            __ptr = (undefined8 *)realloc(__ptr,(long)iVar4 << 3);
            iVar5 = iVar4;
          }
          __ptr[uVar13] = peVar15->e2;
          uVar13 = uVar13 + 1;
          peVar15 = peVar15->e1;
        } while (peVar15->type == EASM_EXPR_VEC);
      }
      else {
        iVar5 = 0;
        uVar13 = 0;
        __ptr = (undefined8 *)0x0;
      }
      if (iVar5 <= (int)uVar13) {
        sVar7 = 0x80;
        if (iVar5 != 0) {
          sVar7 = (long)(iVar5 * 2) << 3;
        }
        __ptr = (undefined8 *)realloc(__ptr,sVar7);
      }
      uVar12 = (ulong)((int)uVar13 + 1);
      __ptr[uVar13 & 0xffffffff] = peVar15;
    }
    iVar5 = (int)uVar12;
    if (1 < iVar5) {
      lVar11 = 0;
      puVar14 = __ptr;
      do {
        uVar2 = *puVar14;
        *puVar14 = __ptr[uVar12 + lVar11 + -1];
        __ptr[uVar12 + lVar11 + -1] = uVar2;
        puVar14 = puVar14 + 1;
        lVar11 = lVar11 + -1;
      } while (-lVar11 != uVar12 >> 1);
    }
    if (iVar5 == 0) {
      local_f8 = 0;
      local_118 = 0;
    }
    else {
      uVar13 = 0;
      uVar16 = 0;
      local_118 = 0;
      local_f8 = 0;
      do {
        iVar4 = *(int *)__ptr[uVar13];
        if (iVar4 == 0x14) {
LAB_0026cecd:
          bVar17 = true;
        }
        else {
          if (iVar4 == 0x11) {
            __s1 = *(char **)((int *)__ptr[uVar13] + 0x10);
            __s = *v;
            sVar7 = strlen(__s);
            iVar4 = strncmp(__s1,__s,sVar7);
            if (iVar4 != 0) {
              bVar17 = false;
              goto LAB_0026ced3;
            }
            uVar8 = strtoull(__s1 + sVar7,&local_f0,10);
            if ((*local_f0 == '\0') &&
               ((uVar3 = uVar8, local_118 == 0 ||
                (bVar17 = uVar8 == uVar16, uVar8 = uVar16, uVar3 = local_f8, bVar17)))) {
              local_f8 = uVar3;
              uVar16 = uVar8 + 1;
              local_118 = local_118 | 1L << (uVar13 & 0x3f);
              bVar17 = true;
            }
            else {
              bVar17 = false;
            }
            if (bVar17) goto LAB_0026cecd;
          }
          bVar17 = false;
        }
LAB_0026ced3:
        if (!bVar17) {
          return (matches *)0x0;
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
    }
    iVar4 = setbf(&local_e8,*(bitfield **)((long)v + 8),local_f8);
    if ((iVar4 != 0) &&
       (iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x10),(long)iVar5), iVar5 != 0)) {
      if (*(bitfield **)((long)v + 0x18) == (bitfield *)0x0) {
        if ((local_118 ^ -1L << ((byte)uVar12 & 0x3f)) == 0xffffffffffffffff) goto LAB_0026cf6e;
      }
      else {
        iVar5 = setbf(&local_e8,*(bitfield **)((long)v + 0x18),local_118);
        if (iVar5 != 0) {
LAB_0026cf6e:
          pmVar9 = (matches *)calloc(0x10,1);
          iVar5 = pmVar9->mnum;
          iVar4 = pmVar9->mmax;
          if (iVar4 <= iVar5) {
            iVar6 = 0x10;
            if (iVar4 != 0) {
              iVar6 = iVar4 * 2;
            }
            pmVar9->mmax = iVar6;
            pmVar10 = (match *)realloc(pmVar9->m,(long)iVar6 * 0xb8);
            pmVar9->m = pmVar10;
          }
          pmVar9->mnum = iVar5 + 1;
          memcpy(pmVar9->m + iVar5,&local_e8,0xb8);
          return pmVar9;
        }
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomvec_a APROTO {
	const struct vec *vec = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	const struct easm_expr **vexprs = 0;
	int vexprsnum = 0;
	int vexprsmax = 0;
	if (expr->type != EASM_EXPR_ZVEC) {
		while (expr->type == EASM_EXPR_VEC) {
			ADDARRAY(vexprs, expr->e2);
			expr = expr->e1;
		}
		ADDARRAY(vexprs, expr);
	}
	int i;
	for (i = 0; i < vexprsnum/2; i++) {
		const struct easm_expr *tmp = vexprs[i];
		vexprs[i] = vexprs[vexprsnum-1-i];
		vexprs[vexprsnum-1-i] = tmp;
	}
	ull start = 0, cnt = vexprsnum, mask = 0, cur = 0;
	for (i = 0; i < cnt; i++) {
		const struct easm_expr *e = vexprs[i];
		if (e->type == EASM_EXPR_DISCARD) {
		} else if (e->type == EASM_EXPR_REG) {
			if (strncmp(e->str, vec->name, strlen(vec->name)))
				return 0;
			char *end;
			ull num = strtoull(e->str + strlen(vec->name), &end, 10);
			if (*end)
				return 0;
			if (mask) {
				if (num != cur)
					return 0;
				cur++;
			} else {
				start = num;
				cur = num + 1;
			}
			mask |= 1ull << i;
		} else {
			return 0;
		}
	}
	if (!setbf(&res, vec->bf, start))
		return 0;
	if (!setbf(&res, vec->cnt, cnt))
		return 0;
	if (vec->mask) {
		if (!setbf(&res, vec->mask, mask))
			return 0;
	} else {
		if (mask != (1ull << cnt) - 1)
		       return 0;	
	}
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}